

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O3

double __thiscall
HighsHessian::objectiveValue(HighsHessian *this,vector<double,_std::allocator<double>_> *solution)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  
  if (0 < (long)this->dim_) {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = 0.0;
    lVar6 = 0;
    iVar7 = *piVar3;
    do {
      dVar1 = pdVar4[lVar6];
      lVar8 = (long)iVar7;
      dVar9 = dVar1 * 0.5 * pdVar5[lVar8] * dVar1 + dVar9;
      iVar2 = piVar3[lVar6 + 1];
      if (iVar7 + 1 < iVar2) {
        do {
          dVar9 = dVar9 + pdVar5[lVar8 + 1] * dVar1 *
                          pdVar4[(this->index_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar8 + 1]];
          lVar8 = lVar8 + 1;
        } while (iVar2 + -1 != (int)lVar8);
      }
      lVar6 = lVar6 + 1;
      iVar7 = iVar2;
    } while (lVar6 != this->dim_);
    return dVar9;
  }
  return 0.0;
}

Assistant:

double HighsHessian::objectiveValue(const std::vector<double>& solution) const {
  double objective_function_value = 0;
  for (HighsInt iCol = 0; iCol < this->dim_; iCol++) {
    HighsInt iEl = this->start_[iCol];
    assert(this->index_[iEl] == iCol);
    objective_function_value +=
        0.5 * solution[iCol] * this->value_[iEl] * solution[iCol];
    for (HighsInt iEl = this->start_[iCol] + 1; iEl < this->start_[iCol + 1];
         iEl++)
      objective_function_value +=
          solution[iCol] * this->value_[iEl] * solution[this->index_[iEl]];
  }
  return objective_function_value;
}